

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx2::DiscMiMBIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  float fVar53;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_270 [16];
  RayQueryContext *local_258;
  RTCFilterFunctionNArguments local_250;
  undefined1 local_220 [32];
  RTCHitN local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  uint local_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  uint local_140 [4];
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  undefined1 auVar71 [64];
  
  pSVar6 = context->scene;
  local_140[0] = Disc->sharedGeomID;
  uVar26 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[local_140[0]].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar12 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar50 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),9);
  auVar50 = vminss_avx(auVar50,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar50 = vmaxss_avx(ZEXT816(0) << 0x20,auVar50);
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar28 = (long)(int)auVar50._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar28);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar28);
  uVar31 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar27);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar26);
  uVar30 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar31);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar32 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar25 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar25);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar33);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar28);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar28);
  auVar43._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar27 * lVar8);
  auVar43._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar26 * lVar8);
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar30 * lVar8);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar31 * lVar8);
  auVar47._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar25 * lVar8);
  auVar47._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar33 * lVar8);
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar29);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar8);
  fVar12 = fVar12 - auVar50._0_4_;
  auVar39 = vunpcklps_avx(auVar37,auVar38);
  local_220 = vunpckhps_avx(auVar37,auVar38);
  auVar13 = vunpcklps_avx(auVar41,auVar42);
  auVar42 = vunpckhps_avx(auVar41,auVar42);
  auVar37 = vunpcklps_avx(auVar39,auVar13);
  auVar39 = vunpckhps_avx(auVar39,auVar13);
  auVar38 = vunpcklps_avx(local_220,auVar42);
  auVar13 = vunpcklps_avx(auVar43,auVar47);
  auVar43 = vunpckhps_avx(auVar43,auVar47);
  auVar41 = vunpcklps_avx(auVar44,auVar51);
  auVar44 = vunpckhps_avx(auVar44,auVar51);
  auVar14 = vunpcklps_avx(auVar13,auVar41);
  auVar13 = vunpckhps_avx(auVar13,auVar41);
  auVar41 = vunpcklps_avx(auVar43,auVar44);
  auVar45._4_4_ = fVar12;
  auVar45._0_4_ = fVar12;
  auVar45._8_4_ = fVar12;
  auVar45._12_4_ = fVar12;
  auVar45._16_4_ = fVar12;
  auVar45._20_4_ = fVar12;
  auVar45._24_4_ = fVar12;
  auVar45._28_4_ = fVar12;
  fVar1 = 1.0 - fVar12;
  auVar48._4_4_ = fVar1;
  auVar48._0_4_ = fVar1;
  auVar48._8_4_ = fVar1;
  auVar48._12_4_ = fVar1;
  auVar48._16_4_ = fVar1;
  auVar48._20_4_ = fVar1;
  auVar48._24_4_ = fVar1;
  auVar48._28_4_ = fVar1;
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = 0x3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar54._16_4_ = 0x3f800000;
  auVar54._20_4_ = 0x3f800000;
  auVar54._24_4_ = 0x3f800000;
  auVar54._28_4_ = 0x3f800000;
  auVar16._4_4_ = auVar14._4_4_ * fVar12;
  auVar16._0_4_ = auVar14._0_4_ * fVar12;
  auVar16._8_4_ = auVar14._8_4_ * fVar12;
  auVar16._12_4_ = auVar14._12_4_ * fVar12;
  auVar16._16_4_ = auVar14._16_4_ * fVar12;
  auVar16._20_4_ = auVar14._20_4_ * fVar12;
  auVar16._24_4_ = auVar14._24_4_ * fVar12;
  auVar16._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar13._4_4_ * fVar12;
  auVar14._0_4_ = auVar13._0_4_ * fVar12;
  auVar14._8_4_ = auVar13._8_4_ * fVar12;
  auVar14._12_4_ = auVar13._12_4_ * fVar12;
  auVar14._16_4_ = auVar13._16_4_ * fVar12;
  auVar14._20_4_ = auVar13._20_4_ * fVar12;
  auVar14._24_4_ = auVar13._24_4_ * fVar12;
  auVar14._28_4_ = auVar13._28_4_;
  auVar13._4_4_ = auVar41._4_4_ * fVar12;
  auVar13._0_4_ = auVar41._0_4_ * fVar12;
  auVar13._8_4_ = auVar41._8_4_ * fVar12;
  auVar13._12_4_ = auVar41._12_4_ * fVar12;
  auVar13._16_4_ = auVar41._16_4_ * fVar12;
  auVar13._20_4_ = auVar41._20_4_ * fVar12;
  auVar13._24_4_ = auVar41._24_4_ * fVar12;
  auVar13._28_4_ = auVar41._28_4_;
  auVar50 = vfmadd231ps_fma(auVar16,auVar48,auVar37);
  auVar35 = vfmadd231ps_fma(auVar14,auVar48,auVar39);
  auVar15 = vfmadd231ps_fma(auVar13,auVar48,auVar38);
  bVar5 = Disc->numPrimitives;
  local_140[1] = local_140[0];
  local_140[2] = local_140[0];
  local_140[3] = local_140[0];
  uStack_130 = local_140[0];
  uStack_12c = local_140[0];
  uStack_128 = local_140[0];
  uStack_124 = local_140[0];
  uVar2 = *(undefined4 *)(ray + k * 4);
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  auVar66._16_4_ = uVar2;
  auVar66._20_4_ = uVar2;
  auVar66._24_4_ = uVar2;
  auVar66._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar68._4_4_ = uVar2;
  auVar68._0_4_ = uVar2;
  auVar68._8_4_ = uVar2;
  auVar68._12_4_ = uVar2;
  auVar68._16_4_ = uVar2;
  auVar68._20_4_ = uVar2;
  auVar68._24_4_ = uVar2;
  auVar68._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar69._4_4_ = uVar2;
  auVar69._0_4_ = uVar2;
  auVar69._8_4_ = uVar2;
  auVar69._12_4_ = uVar2;
  auVar69._16_4_ = uVar2;
  auVar69._20_4_ = uVar2;
  auVar69._24_4_ = uVar2;
  auVar69._28_4_ = uVar2;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar34._4_4_ = fVar1;
  auVar34._0_4_ = fVar1;
  auVar34._8_4_ = fVar1;
  auVar34._12_4_ = fVar1;
  auVar34._16_4_ = fVar1;
  auVar34._20_4_ = fVar1;
  auVar34._24_4_ = fVar1;
  auVar34._28_4_ = fVar1;
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar36._4_4_ = fVar3;
  auVar36._0_4_ = fVar3;
  auVar36._8_4_ = fVar3;
  auVar36._12_4_ = fVar3;
  auVar36._16_4_ = fVar3;
  auVar36._20_4_ = fVar3;
  auVar36._24_4_ = fVar3;
  auVar36._28_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar37 = vsubps_avx(ZEXT1632(auVar50),auVar66);
  auVar50 = vfmadd231ps_fma(ZEXT432((uint)(fVar4 * fVar4)),auVar36,auVar36);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar34,auVar34);
  auVar67._0_4_ = auVar50._0_4_;
  auVar67._4_4_ = auVar67._0_4_;
  auVar67._8_4_ = auVar67._0_4_;
  auVar67._12_4_ = auVar67._0_4_;
  auVar67._16_4_ = auVar67._0_4_;
  auVar67._20_4_ = auVar67._0_4_;
  auVar67._24_4_ = auVar67._0_4_;
  auVar67._28_4_ = auVar67._0_4_;
  auVar39 = vrcpps_avx(auVar67);
  auVar38 = vsubps_avx(ZEXT1632(auVar35),auVar68);
  auVar41 = vsubps_avx(ZEXT1632(auVar15),auVar69);
  auVar50 = vfnmadd231ps_fma(auVar54,auVar39,auVar67);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar39,auVar39);
  fVar59 = auVar41._0_4_;
  fVar60 = auVar41._4_4_;
  auVar17._4_4_ = fVar60 * fVar4;
  auVar17._0_4_ = fVar59 * fVar4;
  fVar61 = auVar41._8_4_;
  auVar17._8_4_ = fVar61 * fVar4;
  fVar62 = auVar41._12_4_;
  auVar17._12_4_ = fVar62 * fVar4;
  fVar63 = auVar41._16_4_;
  auVar17._16_4_ = fVar63 * fVar4;
  fVar64 = auVar41._20_4_;
  auVar17._20_4_ = fVar64 * fVar4;
  fVar65 = auVar41._24_4_;
  auVar17._24_4_ = fVar65 * fVar4;
  auVar17._28_4_ = auVar39._28_4_;
  auVar35 = vfmadd231ps_fma(auVar17,auVar38,auVar36);
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar37,auVar34);
  fVar53 = auVar50._0_4_ * auVar35._0_4_;
  fVar56 = auVar50._4_4_ * auVar35._4_4_;
  fVar57 = auVar50._8_4_ * auVar35._8_4_;
  fVar58 = auVar50._12_4_ * auVar35._12_4_;
  local_e0 = ZEXT1632(CONCAT412(fVar58,CONCAT48(fVar57,CONCAT44(fVar56,fVar53))));
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  auVar39._16_4_ = uVar2;
  auVar39._20_4_ = uVar2;
  auVar39._24_4_ = uVar2;
  auVar39._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar70._16_4_ = uVar2;
  auVar70._20_4_ = uVar2;
  auVar70._24_4_ = uVar2;
  auVar70._28_4_ = uVar2;
  auVar71 = ZEXT3264(auVar70);
  auVar39 = vcmpps_avx(auVar39,local_e0,2);
  auVar13 = vcmpps_avx(local_e0,auVar70,2);
  auVar39 = vandps_avx(auVar13,auVar39);
  auVar40._1_3_ = 0;
  auVar40[0] = bVar5;
  auVar40[4] = bVar5;
  auVar40._5_3_ = 0;
  auVar40[8] = bVar5;
  auVar40._9_3_ = 0;
  auVar40[0xc] = bVar5;
  auVar40._13_3_ = 0;
  auVar40[0x10] = bVar5;
  auVar40._17_3_ = 0;
  auVar40[0x14] = bVar5;
  auVar40._21_3_ = 0;
  auVar40[0x18] = bVar5;
  auVar40._25_3_ = 0;
  auVar40[0x1c] = bVar5;
  auVar40._29_3_ = 0;
  auVar14 = vpcmpgtd_avx2(auVar40,_DAT_01fb4ba0);
  auVar13 = auVar14 & auVar39;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar39 = vandps_avx(auVar39,auVar14);
    auVar50 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
    auVar39 = vunpckhps_avx(local_220,auVar42);
    auVar13 = vunpckhps_avx(auVar43,auVar44);
    auVar18._4_4_ = fVar12 * auVar13._4_4_;
    auVar18._0_4_ = fVar12 * auVar13._0_4_;
    auVar18._8_4_ = fVar12 * auVar13._8_4_;
    auVar18._12_4_ = fVar12 * auVar13._12_4_;
    auVar18._16_4_ = fVar12 * auVar13._16_4_;
    auVar18._20_4_ = fVar12 * auVar13._20_4_;
    auVar18._24_4_ = fVar12 * auVar13._24_4_;
    auVar18._28_4_ = auVar13._28_4_;
    auVar35 = vfmadd231ps_fma(auVar18,auVar48,auVar39);
    auVar19._4_4_ = fVar56 * fVar1;
    auVar19._0_4_ = fVar53 * fVar1;
    auVar19._8_4_ = fVar57 * fVar1;
    auVar19._12_4_ = fVar58 * fVar1;
    auVar19._16_4_ = fVar1 * 0.0;
    auVar19._20_4_ = fVar1 * 0.0;
    auVar19._24_4_ = fVar1 * 0.0;
    auVar19._28_4_ = auVar39._28_4_;
    auVar20._4_4_ = fVar56 * fVar3;
    auVar20._0_4_ = fVar53 * fVar3;
    auVar20._8_4_ = fVar57 * fVar3;
    auVar20._12_4_ = fVar58 * fVar3;
    auVar20._16_4_ = fVar3 * 0.0;
    auVar20._20_4_ = fVar3 * 0.0;
    auVar20._24_4_ = fVar3 * 0.0;
    auVar20._28_4_ = auVar43._28_4_;
    auVar21._4_4_ = fVar56 * fVar4;
    auVar21._0_4_ = fVar53 * fVar4;
    auVar21._8_4_ = fVar57 * fVar4;
    auVar21._12_4_ = fVar58 * fVar4;
    auVar21._16_4_ = fVar4 * 0.0;
    auVar21._20_4_ = fVar4 * 0.0;
    auVar21._24_4_ = fVar4 * 0.0;
    auVar21._28_4_ = auVar44._28_4_;
    auVar39 = vsubps_avx(auVar37,auVar19);
    auVar13 = vsubps_avx(auVar38,auVar20);
    auVar41 = vsubps_avx(auVar41,auVar21);
    auVar22._4_4_ = auVar41._4_4_ * auVar41._4_4_;
    auVar22._0_4_ = auVar41._0_4_ * auVar41._0_4_;
    auVar22._8_4_ = auVar41._8_4_ * auVar41._8_4_;
    auVar22._12_4_ = auVar41._12_4_ * auVar41._12_4_;
    auVar22._16_4_ = auVar41._16_4_ * auVar41._16_4_;
    auVar22._20_4_ = auVar41._20_4_ * auVar41._20_4_;
    auVar22._24_4_ = auVar41._24_4_ * auVar41._24_4_;
    auVar22._28_4_ = auVar41._28_4_;
    auVar15 = vfmadd231ps_fma(auVar22,auVar13,auVar13);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar39,auVar39);
    auVar23._28_4_ = auVar39._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar35._12_4_ * auVar35._12_4_,
                            CONCAT48(auVar35._8_4_ * auVar35._8_4_,
                                     CONCAT44(auVar35._4_4_ * auVar35._4_4_,
                                              auVar35._0_4_ * auVar35._0_4_))));
    auVar39 = vcmpps_avx(ZEXT1632(auVar15),auVar23,2);
    auVar35 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
    auVar50 = vpand_avx(auVar50,auVar35);
    auVar39 = vpmovsxwd_avx2(auVar50);
    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0x7f,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar39 >> 0xbf,0) != '\0') ||
        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar39[0x1f] < '\0')
    {
      auVar24._4_4_ = fVar60 * fVar60;
      auVar24._0_4_ = fVar59 * fVar59;
      auVar24._8_4_ = fVar61 * fVar61;
      auVar24._12_4_ = fVar62 * fVar62;
      auVar24._16_4_ = fVar63 * fVar63;
      auVar24._20_4_ = fVar64 * fVar64;
      auVar24._24_4_ = fVar65 * fVar65;
      auVar24._28_4_ = auVar39._28_4_;
      auVar35 = vfmadd213ps_fma(auVar38,auVar38,auVar24);
      auVar15 = vfmadd213ps_fma(auVar37,auVar37,ZEXT1632(auVar35));
      auVar39 = vcmpps_avx(ZEXT1632(auVar15),auVar23,6);
      auVar35 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
      auVar50 = vpand_avx(auVar50,auVar35);
      auVar39 = vpmovsxwd_avx2(auVar50);
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        local_a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_a0._8_4_ = -fVar3;
        local_a0._12_4_ = -fVar3;
        local_a0._16_4_ = -fVar3;
        local_a0._20_4_ = -fVar3;
        local_a0._24_4_ = -fVar3;
        local_a0._28_4_ = -fVar3;
        local_80[0]._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_80[0]._8_4_ = -fVar4;
        local_80[0]._12_4_ = -fVar4;
        local_80[0]._16_4_ = -fVar4;
        local_80[0]._20_4_ = -fVar4;
        local_80[0]._24_4_ = -fVar4;
        local_80[0]._28_4_ = -fVar4;
        local_100 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_120 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        auVar50 = vpacksswb_avx(auVar50,auVar50);
        uVar29 = (ulong)(byte)(SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar50 >> 0x37,0) & 1) << 6 | SUB161(auVar50 >> 0x3f,0) << 7
                              );
        auVar39 = vpcmpeqd_avx2(auVar45,auVar45);
        auVar46 = ZEXT3264(auVar39);
        auVar49 = ZEXT464(0) << 0x20;
        auVar50 = vpcmpeqd_avx(auVar15,auVar15);
        auVar52 = ZEXT1664(auVar50);
        auVar55 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_258 = context;
        do {
          local_250.hit = local_1f0;
          local_250.valid = (int *)local_270;
          uVar26 = 0;
          for (uVar25 = uVar29; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            uVar26 = uVar26 + 1;
          }
          local_190 = local_140[uVar26];
          pGVar7 = (pSVar6->geometries).items[local_190].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar29 = uVar29 ^ 1L << (uVar26 & 0x3f);
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar25 = (ulong)(uint)((int)uVar26 * 4);
            local_1c0 = *(undefined4 *)(local_120 + uVar25);
            uVar2 = *(undefined4 *)(local_100 + uVar25);
            local_1b0._4_4_ = uVar2;
            local_1b0._0_4_ = uVar2;
            local_1b0._8_4_ = uVar2;
            local_1b0._12_4_ = uVar2;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar25);
            local_250.context = context->user;
            uVar2 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar25);
            local_1a0._4_4_ = uVar2;
            local_1a0._0_4_ = uVar2;
            local_1a0._8_4_ = uVar2;
            local_1a0._12_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)local_c0 + uVar25);
            local_1f0._4_4_ = uVar2;
            local_1f0._0_4_ = uVar2;
            local_1f0._8_4_ = uVar2;
            local_1f0._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_a0 + uVar25);
            local_1e0._4_4_ = uVar2;
            local_1e0._0_4_ = uVar2;
            local_1e0._8_4_ = uVar2;
            local_1e0._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_80[0] + uVar25);
            local_1d0._4_4_ = uVar2;
            local_1d0._0_4_ = uVar2;
            local_1d0._8_4_ = uVar2;
            local_1d0._12_4_ = uVar2;
            uStack_17c = (local_250.context)->instID[0];
            local_180 = uStack_17c;
            uStack_178 = uStack_17c;
            uStack_174 = uStack_17c;
            uStack_170 = (local_250.context)->instPrimID[0];
            uStack_16c = uStack_170;
            uStack_168 = uStack_170;
            uStack_164 = uStack_170;
            local_270 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
            local_250.geometryUserPtr = pGVar7->userPtr;
            local_250.N = 4;
            local_160 = auVar71._0_32_;
            local_220._0_8_ = uVar29;
            local_250.ray = (RTCRayN *)ray;
            uStack_1bc = local_1c0;
            uStack_1b8 = local_1c0;
            uStack_1b4 = local_1c0;
            uStack_18c = local_190;
            uStack_188 = local_190;
            uStack_184 = local_190;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar39 = ZEXT1632(auVar46._0_16_);
              auVar50 = auVar52._0_16_;
              (*pGVar7->occlusionFilterN)(&local_250);
              auVar55 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              auVar52 = ZEXT1664(auVar50);
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
              auVar46 = ZEXT3264(auVar39);
              auVar71 = ZEXT3264(local_160);
              uVar29 = local_220._0_8_;
            }
            auVar50 = auVar52._0_16_;
            if (local_270 == (undefined1  [16])0x0) {
              auVar35 = vpcmpeqd_avx(auVar49._0_16_,(undefined1  [16])0x0);
              auVar50 = auVar50 ^ auVar35;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                auVar39 = ZEXT1632(auVar46._0_16_);
                (*p_Var11)(&local_250);
                auVar55 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar50 = vpcmpeqd_avx(auVar50,auVar50);
                auVar52 = ZEXT1664(auVar50);
                auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
                auVar46 = ZEXT3264(auVar39);
                auVar71 = ZEXT3264(local_160);
                uVar29 = local_220._0_8_;
              }
              auVar35 = vpcmpeqd_avx(auVar49._0_16_,local_270);
              auVar50 = auVar52._0_16_ ^ auVar35;
              auVar35 = vblendvps_avx(auVar55._0_16_,*(undefined1 (*) [16])(local_250.ray + 0x80),
                                      auVar35);
              *(undefined1 (*) [16])(local_250.ray + 0x80) = auVar35;
            }
            auVar35._8_8_ = 0x100000001;
            auVar35._0_8_ = 0x100000001;
            if ((auVar35 & auVar50) != (undefined1  [16])0x0) {
              return true;
            }
            *(int *)(ray + k * 4 + 0x80) = auVar71._0_4_;
            uVar29 = uVar29 ^ 1L << (uVar26 & 0x3f);
          }
        } while (uVar29 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0, Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }